

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IdlFbInterfaces.h
# Opt level: O0

void __thiscall
Firebird::
IVersionedBaseImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IStatus>_>
::IVersionedBaseImpl
          (IVersionedBaseImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IStatus>_>
           *this)

{
  int iVar1;
  IVersionedBaseImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IStatus>_>
  *this_local;
  
  Inherit<Firebird::IStatus>::Inherit();
  if (IVersionedBaseImpl<Firebird::ThrowStatusWrapper,Firebird::ThrowStatusWrapper,Firebird::Inherit<Firebird::IStatus>>
      ::IVersionedBaseImpl(Firebird::DoNotInherit)::vTable == '\0') {
    iVar1 = __cxa_guard_acquire(&IVersionedBaseImpl<Firebird::ThrowStatusWrapper,Firebird::ThrowStatusWrapper,Firebird::Inherit<Firebird::IStatus>>
                                 ::IVersionedBaseImpl(Firebird::DoNotInherit)::vTable);
    if (iVar1 != 0) {
      IVersionedBaseImpl::VTableImpl::VTableImpl(&IVersionedBaseImpl::vTable);
      __cxa_guard_release(&IVersionedBaseImpl<Firebird::ThrowStatusWrapper,Firebird::ThrowStatusWrapper,Firebird::Inherit<Firebird::IStatus>>
                           ::IVersionedBaseImpl(Firebird::DoNotInherit)::vTable);
    }
  }
  (this->super_Inherit<Firebird::IStatus>).super_IStatus.super_IDisposable.super_IVersioned.
  cloopVTable = (VTable *)&IVersionedBaseImpl::vTable;
  return;
}

Assistant:

IVersionedBaseImpl(DoNotInherit = DoNotInherit())
		{
			static struct VTableImpl : Base::VTable
			{
				VTableImpl()
				{
					this->version = Base::VERSION;
				}
			} vTable;

			this->cloopVTable = &vTable;
		}